

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogManager.cpp
# Opt level: O1

void __thiscall gnilk::LogManager::Initialize(LogManager *this)

{
  int iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  LogIPCQueue *pLVar3;
  LogIPCBase *__tmp;
  pointer *__ptr;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  LogIPCQueue *in_stack_ffffffffffffffd8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  thread local_18;
  
  if (this->isInitialized != false) {
    return;
  }
  LogCache::Create((size_t)in_stack_ffffffffffffffd8);
  _Var4._M_pi = _Stack_20._M_pi;
  _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var2 = (this->cache).super___shared_ptr<gnilk::LogCache,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  (this->cache).super___shared_ptr<gnilk::LogCache,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in_stack_ffffffffffffffd8;
  (this->cache).super___shared_ptr<gnilk::LogCache,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  if (_Stack_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_20._M_pi);
  }
  RegisterDefaultSinks(this);
  if ((this->ipcHandler).super___shared_ptr<gnilk::LogIPCBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) goto LAB_0018932b;
  if (this->ipcMechanism == kPipe) {
    pLVar3 = (LogIPCQueue *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<gnilk::LogIPCPipeUnix,std::allocator<gnilk::LogIPCPipeUnix>>
              (&_Stack_20,(LogIPCPipeUnix **)&stack0xffffffffffffffd8,
               (allocator<gnilk::LogIPCPipeUnix> *)&local_18);
LAB_001892f1:
    _Var4._M_pi = _Stack_20._M_pi;
    _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var2 = (this->ipcHandler).super___shared_ptr<gnilk::LogIPCBase,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (this->ipcHandler).super___shared_ptr<gnilk::LogIPCBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &pLVar3->super_LogIPCBase;
    (this->ipcHandler).super___shared_ptr<gnilk::LogIPCBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = _Var4._M_pi;
    _Var4._M_pi = _Stack_20._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      _Var4._M_pi = _Stack_20._M_pi;
    }
  }
  else {
    if (this->ipcMechanism != kFifo) {
      pLVar3 = (LogIPCQueue *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<gnilk::LogIPCQueue,std::allocator<gnilk::LogIPCQueue>>
                (&_Stack_20,(LogIPCQueue **)&stack0xffffffffffffffd8,
                 (allocator<gnilk::LogIPCQueue> *)&local_18);
      goto LAB_001892f1;
    }
    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x48);
    p_Var2->_M_use_count = 1;
    p_Var2->_M_weak_count = 1;
    p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00227790;
    p_Var2[1]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var2[1]._M_use_count = 0;
    p_Var2[1]._M_weak_count = 0;
    p_Var2[2]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var2[2]._M_use_count = 0;
    p_Var2[2]._M_weak_count = 0;
    p_Var2[3]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var2[3]._M_use_count = 0;
    p_Var2[3]._M_weak_count = 0;
    p_Var2[1]._vptr__Sp_counted_base = (_func_int **)&PTR__LogIPCFifoUnix_00227af8;
    *(undefined1 *)&p_Var2[1]._M_use_count = 0;
    p_Var2[2]._vptr__Sp_counted_base = (_func_int **)(p_Var2 + 3);
    p_Var2[2]._M_use_count = 0;
    p_Var2[2]._M_weak_count = 0;
    *(undefined1 *)&p_Var2[3]._vptr__Sp_counted_base = 0;
    p_Var2[4]._vptr__Sp_counted_base = (_func_int **)0xffffffffffffffff;
    (this->ipcHandler).super___shared_ptr<gnilk::LogIPCBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)(p_Var2 + 1);
    _Var4._M_pi = (this->ipcHandler).
                  super___shared_ptr<gnilk::LogIPCBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
    (this->ipcHandler).super___shared_ptr<gnilk::LogIPCBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = p_Var2;
  }
  if (_Var4._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var4._M_pi);
  }
  iVar1 = (*((this->ipcHandler).super___shared_ptr<gnilk::LogIPCBase,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_LogIPCBase[2])();
  if ((char)iVar1 == '\0') {
    exit(1);
  }
LAB_0018932b:
  this->isInitialized = true;
  local_18._M_id._M_thread = (id)0;
  pLVar3 = (LogIPCQueue *)operator_new(0x10);
  ((LogIPCBase *)&(pLVar3->super_LogIPCBase)._vptr_LogIPCBase)->_vptr_LogIPCBase =
       (_func_int **)&PTR___State_00227618;
  *(LogManager **)&pLVar3->isClosed = this;
  std::thread::_M_start_thread(&local_18,&stack0xffffffffffffffd8,0);
  if (pLVar3 != (LogIPCQueue *)0x0) {
    (*((LogIPCBase *)&(pLVar3->super_LogIPCBase)._vptr_LogIPCBase)->_vptr_LogIPCBase[1])();
  }
  if ((this->sinkThread)._M_id._M_thread == 0) {
    (this->sinkThread)._M_id._M_thread = (native_handle_type)local_18._M_id._M_thread;
    return;
  }
  std::terminate();
}

Assistant:

void LogManager::Initialize() {
    if (isInitialized) {
        return;
    }

    // IF we support some kind of configuration - except for compile time - we should deal with it here..
    // Option 2 - copy the 'property' object concept over from old logger and set all defaults in it - let the
    // app have the ability to supply/create/modify the Property object before we initialize...

    cache = LogCache::Create(cacheCapacity);

    RegisterDefaultSinks();

    // This should NOT happen - but let's check anyway...
    if (ipcHandler == nullptr) {
        switch(ipcMechanism) {
#ifndef WIN32
            case IPCMechanism::kFifo :
                ipcHandler = std::make_shared<LogIPCFifoUnix>();
                break;
            case IPCMechanism::kPipe :
                ipcHandler = std::make_shared<LogIPCPipeUnix>();
                break;
#endif
            case IPCMechanism::kQueue :
            default:
                ipcHandler = std::make_shared<LogIPCQueue>();
                break;
        }
        if (!ipcHandler->Open()) {
            exit(1);
        }
    }

    isInitialized = true;

    sinkThread = std::thread([this]() {
        bQuitSinkThread = false;
        SinkThread();
    });


}